

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

socket_t __thiscall httplib::Client::create_client_socket(Client *this)

{
  socket_t sVar1;
  char *host;
  Client *this_local;
  
  host = (char *)std::__cxx11::string::c_str();
  sVar1 = detail::
          create_socket<httplib::Client::create_client_socket()const::_lambda(int,addrinfo&)_1_>
                    (host,this->port_,(anon_class_8_1_8991fb9c)this,0);
  return sVar1;
}

Assistant:

inline socket_t Client::create_client_socket() const
{
    return detail::create_socket(host_.c_str(), port_,
        [=](socket_t sock, struct addrinfo& ai) -> bool {
            detail::set_nonblocking(sock, true);

            auto ret = connect(sock, ai.ai_addr, ai.ai_addrlen);
            if (ret < 0) {
                if (detail::is_connection_error() ||
                    !detail::wait_until_socket_is_ready(sock, timeout_sec_, 0)) {
                    detail::close_socket(sock);
                    return false;
                }
            }

            detail::set_nonblocking(sock, false);
            return true;
        });
}